

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::setAllX(SVInt *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t uVar3;
  size_t __n;
  uint64_t *__s;
  SVInt *in_RDI;
  SVInt *unaff_retaddr;
  uint32_t i;
  uint32_t words;
  uint local_10;
  
  uVar3 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
  local_10 = uVar3;
  if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    bVar2 = isSingleWord(in_RDI);
    if ((!bVar2) && ((in_RDI->super_SVIntStorage).field_0.val != 0)) {
      operator_delete__((void *)0x350c78);
    }
    (in_RDI->super_SVIntStorage).unknownFlag = true;
    auVar1 = ZEXT416(uVar3 << 1) * ZEXT816(8);
    __n = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      __n = 0xffffffffffffffff;
    }
    __s = (uint64_t *)operator_new__(0x350cb1);
    memset(__s,0,__n);
    (in_RDI->super_SVIntStorage).field_0.pVal = __s;
  }
  else {
    memset((in_RDI->super_SVIntStorage).field_0.pVal,0,(ulong)(uVar3 << 3));
  }
  for (; local_10 < uVar3 << 1; local_10 = local_10 + 1) {
    (in_RDI->super_SVIntStorage).field_0.pVal[local_10] = 0xffffffffffffffff;
  }
  clearUnusedBits(unaff_retaddr);
  return;
}

Assistant:

void SVInt::setAllX() {
    // first set low half to zero (for X)
    uint32_t words = getNumWords(bitWidth, false);
    if (unknownFlag)
        memset(pVal, 0, words * WORD_SIZE);
    else {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[words * 2]();
    }

    // now set upper half to ones (for unknown)
    for (uint32_t i = words; i < words * 2; i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}